

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void highbd_filter_intra_edge_corner(uint16_t *p_above,uint16_t *p_left)

{
  uint16_t uVar1;
  int s;
  int kernel [3];
  uint16_t *p_left_local;
  uint16_t *p_above_local;
  
  uVar1 = (uint16_t)((int)((uint)*p_left * 5 + (uint)p_above[-1] * 6 + (uint)*p_above * 5 + 8) >> 4)
  ;
  p_above[-1] = uVar1;
  p_left[-1] = uVar1;
  return;
}

Assistant:

static void highbd_filter_intra_edge_corner(uint16_t *p_above,
                                            uint16_t *p_left) {
  const int kernel[3] = { 5, 6, 5 };

  int s = (p_left[0] * kernel[0]) + (p_above[-1] * kernel[1]) +
          (p_above[0] * kernel[2]);
  s = (s + 8) >> 4;
  p_above[-1] = s;
  p_left[-1] = s;
}